

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O2

Value * __thiscall
anon_unknown.dwarf_1190bb6::Target::DumpLinkCommandFragments
          (Value *__return_storage_ptr__,Target *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pBVar3;
  cmLocalGenerator *this_00;
  cmGlobalGenerator *pcVar4;
  ValueHolder role;
  cmOutputConverter *pcVar5;
  pointer pBVar6;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  allocator<char> local_1c1;
  Value *local_1c0;
  ValueHolder local_1b8;
  size_type local_1b0;
  size_type local_1a8;
  _Hash_node_base *p_Stack_1a0;
  undefined4 local_198;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> frag;
  pointer local_158;
  string frameworkPath;
  string linkLanguageFlags;
  undefined1 local_110 [40];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkLibs;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkPath;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkFlags;
  string local_90 [8];
  __buckets_ptr local_88;
  undefined1 local_80 [16];
  ValueHolder local_70;
  undefined1 local_68 [16];
  _Hash_node_base *p_Stack_58;
  allocator<char> local_50 [32];
  
  local_1c0 = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  paVar1 = &linkLanguageFlags.field_2;
  linkLanguageFlags._M_string_length = 0;
  linkLanguageFlags.field_2._M_local_buf[0] = '\0';
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkFlags.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkPath.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkLibs.
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linkLanguageFlags._M_dataplus._M_p = (pointer)paVar1;
  this_00 = cmGeneratorTarget::GetLocalGenerator(this->GT);
  pcVar4 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
  pcVar5 = &this_00->super_cmOutputConverter;
  if (this_00 == (cmLocalGenerator *)0x0) {
    pcVar5 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_1b8,this_00);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&frag,(cmStateSnapshot *)&local_1b8);
  (*pcVar4->_vptr_cmGlobalGenerator[0x10])(&local_158,pcVar4,pcVar5,&frag);
  role.string_ = (char *)&linkLibs;
  cmLocalGenerator::GetTargetFlags
            (this_00,(cmLinkLineComputer *)local_158,this->Config,
             (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)role.map_,&linkLanguageFlags,&linkFlags,&frameworkPath,&linkPath,this->GT);
  str._M_str = linkLanguageFlags._M_dataplus._M_p;
  str._M_len = linkLanguageFlags._M_string_length;
  cmTrimWhitespace_abi_cxx11_(&frag.Value,str);
  std::__cxx11::string::operator=((string *)&linkLanguageFlags,(string *)&frag);
  std::__cxx11::string::~string((string *)&frag);
  str_00._M_str = frameworkPath._M_dataplus._M_p;
  str_00._M_len = frameworkPath._M_string_length;
  cmTrimWhitespace_abi_cxx11_(&frag.Value,str_00);
  std::__cxx11::string::operator=((string *)&frameworkPath,(string *)&frag);
  std::__cxx11::string::~string((string *)&frag);
  sVar2 = linkLanguageFlags._M_string_length;
  if (linkLanguageFlags._M_string_length != 0) {
    role.string_ = local_68 + 8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkLanguageFlags._M_dataplus._M_p == paVar1) {
      p_Stack_58 = (_Hash_node_base *)linkLanguageFlags.field_2._8_8_;
      linkLanguageFlags._M_dataplus._M_p = role.string_;
    }
    local_68._9_7_ = linkLanguageFlags.field_2._M_allocated_capacity._1_7_;
    local_68[8] = linkLanguageFlags.field_2._M_local_buf[0];
    linkLanguageFlags._M_string_length = 0;
    linkLanguageFlags.field_2._M_local_buf[0] = '\0';
    local_1b8 = (ValueHolder)linkLanguageFlags._M_dataplus._M_p;
    if (linkLanguageFlags._M_dataplus._M_p == role) {
      p_Stack_1a0 = p_Stack_58;
      local_1b8.string_ = (char *)&local_1a8;
    }
    local_1a8 = local_68._8_8_;
    local_1b0 = sVar2;
    local_68._0_8_ = 0;
    local_68._8_8_ = (ulong)(uint7)linkLanguageFlags.field_2._M_allocated_capacity._1_7_ << 8;
    local_198 = 0xffffffff;
    linkLanguageFlags._M_dataplus._M_p = (pointer)paVar1;
    local_70.string_ = role.string_;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"flags",local_50);
    DumpCommandFragment((Value *)&frag,(Target *)&local_1b8,
                        (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_110,(string *)role.map_);
    Json::Value::append(local_1c0,(Value *)&frag);
    Json::Value::~Value((Value *)&frag);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)&local_1b8.bool_);
    std::__cxx11::string::~string((string *)&local_70.bool_);
  }
  pBVar3 = linkFlags.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkFlags.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkFlags.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (pBVar6 = linkFlags.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar6 != pBVar3; pBVar6 = pBVar6 + 1)
    {
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&frag,pBVar6);
      str_01._M_str = frag.Value._M_dataplus._M_p;
      str_01._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_1b8,str_01);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_1b8.bool_);
      std::__cxx11::string::~string((string *)&local_1b8.bool_);
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,this,&frag);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"flags",&local_1c1);
      DumpCommandFragment((Value *)&local_1b8,(Target *)local_110,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_50,(string *)role.map_);
      Json::Value::append(local_1c0,(Value *)&local_1b8);
      Json::Value::~Value((Value *)&local_1b8);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string((string *)local_110);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&frag);
    }
  }
  sVar2 = frameworkPath._M_string_length;
  if (frameworkPath._M_string_length != 0) {
    role.string_ = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)frameworkPath._M_dataplus._M_p == &frameworkPath.field_2) {
      local_80._8_8_ = frameworkPath.field_2._8_8_;
      frameworkPath._M_dataplus._M_p = role.string_;
    }
    local_80._1_7_ = frameworkPath.field_2._M_allocated_capacity._1_7_;
    local_80[0] = frameworkPath.field_2._M_local_buf[0];
    frameworkPath._M_string_length = 0;
    frameworkPath.field_2._M_local_buf[0] = '\0';
    local_1b8 = (ValueHolder)frameworkPath._M_dataplus._M_p;
    if (frameworkPath._M_dataplus._M_p == role) {
      p_Stack_1a0 = (_Hash_node_base *)local_80._8_8_;
      local_1b8.string_ = (char *)&local_1a8;
    }
    local_1a8 = local_80._0_8_;
    local_1b0 = sVar2;
    local_88 = (__buckets_ptr)0x0;
    local_80._0_8_ = (ulong)(uint7)frameworkPath.field_2._M_allocated_capacity._1_7_ << 8;
    local_198 = 0xffffffff;
    frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
    local_90 = (string  [8])role.string_;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_110,"frameworkPath",local_50)
    ;
    DumpCommandFragment((Value *)&frag,(Target *)&local_1b8,
                        (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_110,(string *)role.map_);
    Json::Value::append(local_1c0,(Value *)&frag);
    Json::Value::~Value((Value *)&frag);
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)&local_1b8.bool_);
    std::__cxx11::string::~string(local_90);
  }
  pBVar3 = linkPath.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkPath.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkPath.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (pBVar6 = linkPath.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar6 != pBVar3; pBVar6 = pBVar6 + 1)
    {
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&frag,pBVar6);
      str_02._M_str = frag.Value._M_dataplus._M_p;
      str_02._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_1b8,str_02);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_1b8.bool_);
      std::__cxx11::string::~string((string *)&local_1b8.bool_);
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,this,&frag);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,"libraryPath",&local_1c1);
      DumpCommandFragment((Value *)&local_1b8,(Target *)local_110,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_50,(string *)role.map_);
      Json::Value::append(local_1c0,(Value *)&local_1b8);
      Json::Value::~Value((Value *)&local_1b8);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string((string *)local_110);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&frag);
    }
  }
  pBVar3 = linkLibs.
           super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (linkLibs.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      linkLibs.
      super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (pBVar6 = linkLibs.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pBVar6 != pBVar3; pBVar6 = pBVar6 + 1)
    {
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                (&frag,pBVar6);
      str_03._M_str = frag.Value._M_dataplus._M_p;
      str_03._M_len = frag.Value._M_string_length;
      cmTrimWhitespace_abi_cxx11_((string *)&local_1b8,str_03);
      std::__cxx11::string::operator=((string *)&frag,(string *)&local_1b8.bool_);
      std::__cxx11::string::~string((string *)&local_1b8.bool_);
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_110,this,&frag);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"libraries",&local_1c1);
      DumpCommandFragment((Value *)&local_1b8,(Target *)local_110,
                          (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_50,(string *)role.map_);
      Json::Value::append(local_1c0,(Value *)&local_1b8);
      Json::Value::~Value((Value *)&local_1b8);
      std::__cxx11::string::~string((string *)local_50);
      std::__cxx11::string::~string((string *)local_110);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                (&frag);
    }
  }
  if (local_158 != (pointer)0x0) {
    (**(_func_int **)((long)(local_158->Name)._M_dataplus._M_p + 8))();
  }
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkLibs);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&linkFlags);
  std::__cxx11::string::~string((string *)&linkLanguageFlags);
  return local_1c0;
}

Assistant:

Json::Value Target::DumpLinkCommandFragments()
{
  Json::Value linkFragments = Json::arrayValue;

  std::string linkLanguageFlags;
  std::vector<BT<std::string>> linkFlags;
  std::string frameworkPath;
  std::vector<BT<std::string>> linkPath;
  std::vector<BT<std::string>> linkLibs;
  cmLocalGenerator* lg = this->GT->GetLocalGenerator();
  cmGlobalGenerator* gg = this->GT->GetGlobalGenerator();
  std::unique_ptr<cmLinkLineComputer> linkLineComputer =
    gg->CreateLinkLineComputer(lg, lg->GetStateSnapshot().GetDirectory());
  lg->GetTargetFlags(linkLineComputer.get(), this->Config, linkLibs,
                     linkLanguageFlags, linkFlags, frameworkPath, linkPath,
                     this->GT);
  linkLanguageFlags = cmTrimWhitespace(linkLanguageFlags);
  frameworkPath = cmTrimWhitespace(frameworkPath);

  if (!linkLanguageFlags.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(linkLanguageFlags), "flags"));
  }

  if (!linkFlags.empty()) {
    for (BT<std::string> frag : linkFlags) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "flags"));
    }
  }

  if (!frameworkPath.empty()) {
    linkFragments.append(
      this->DumpCommandFragment(std::move(frameworkPath), "frameworkPath"));
  }

  if (!linkPath.empty()) {
    for (BT<std::string> frag : linkPath) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "libraryPath"));
    }
  }

  if (!linkLibs.empty()) {
    for (BT<std::string> frag : linkLibs) {
      frag.Value = cmTrimWhitespace(frag.Value);
      linkFragments.append(
        this->DumpCommandFragment(this->ToJBT(frag), "libraries"));
    }
  }

  return linkFragments;
}